

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityGenerator.h
# Opt level: O3

Entity_State_PDU * EntityGenerator::GenerateEntity(void)

{
  Entity_State_PDU *in_RDI;
  KString local_2b0;
  EntityType EntType;
  EntityIdentifier EntID;
  EntityCapabilities EntEC;
  EntityAppearance EntEA;
  Vector EntityLinearVelocity;
  EntityMarking EntMarking;
  WorldCoordinates EntityLocation;
  DeadReckoningParameter DRP;
  KStringStream name;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  id = id + 1;
  KDIS::DATA_TYPE::EntityIdentifier::EntityIdentifier(&EntID,1,0xbb9,(KUINT16)id);
  KDIS::DATA_TYPE::EntityType::EntityType(&EntType,'\x03','\x01',0xe1,'\x03','\0','\x01','\0');
  KDIS::DATA_TYPE::Vector::Vector(&EntityLinearVelocity,0.0,0.0,0.0);
  KDIS::DATA_TYPE::WorldCoordinates::WorldCoordinates
            (&EntityLocation,3974445.65712107,220612.57183252,4966838.38051275);
  KDIS::DATA_TYPE::EntityAppearance::EntityAppearance(&EntEA);
  KDIS::DATA_TYPE::Vector::Vector((Vector *)&name,0.0,0.0,0.0);
  KDIS::DATA_TYPE::Vector::Vector((Vector *)&local_2b0,0.0,0.0,0.0);
  KDIS::DATA_TYPE::DeadReckoningParameter::DeadReckoningParameter
            (&DRP,Static,(Vector *)&name,(Vector *)&local_2b0);
  KDIS::DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)&local_2b0);
  KDIS::DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)&name);
  std::__cxx11::stringstream::stringstream((stringstream *)&name);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Ent-",4);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  KDIS::DATA_TYPE::EntityMarking::EntityMarking(&EntMarking,ASCII,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  KDIS::DATA_TYPE::EntityCapabilities::EntityCapabilities(&EntEC,false,false,false,false);
  KDIS::DATA_TYPE::EulerAngles::EulerAngles((EulerAngles *)&local_2b0);
  KDIS::PDU::Entity_State_PDU::Entity_State_PDU
            (in_RDI,&EntID,Friendly,&EntType,&EntType,&EntityLinearVelocity,&EntityLocation,
             (EulerAngles *)&local_2b0,&EntEA,&DRP,&EntMarking,&EntEC);
  KDIS::DATA_TYPE::EulerAngles::~EulerAngles((EulerAngles *)&local_2b0);
  KDIS::PDU::Header6::SetExerciseID((Header6 *)in_RDI,'\x01');
  KDIS::DATA_TYPE::TimeStamp::TimeStamp((TimeStamp *)&local_2b0,RelativeTime,0,true);
  KDIS::PDU::Header6::SetTimeStamp((Header6 *)in_RDI,(TimeStamp *)&local_2b0);
  KDIS::DATA_TYPE::TimeStamp::~TimeStamp((TimeStamp *)&local_2b0);
  KDIS::DATA_TYPE::EntityCapabilities::~EntityCapabilities(&EntEC);
  KDIS::DATA_TYPE::EntityMarking::~EntityMarking(&EntMarking);
  std::__cxx11::stringstream::~stringstream((stringstream *)&name);
  std::ios_base::~ios_base(local_138);
  KDIS::DATA_TYPE::DeadReckoningParameter::~DeadReckoningParameter(&DRP);
  KDIS::DATA_TYPE::EntityAppearance::~EntityAppearance(&EntEA);
  KDIS::DATA_TYPE::DataTypeBase::~DataTypeBase(&EntityLocation.super_DataTypeBase);
  KDIS::DATA_TYPE::DataTypeBase::~DataTypeBase(&EntityLinearVelocity.super_DataTypeBase);
  KDIS::DATA_TYPE::DataTypeBase::~DataTypeBase(&EntType.super_DataTypeBase);
  KDIS::DATA_TYPE::EntityIdentifier::~EntityIdentifier(&EntID);
  return in_RDI;
}

Assistant:

static Entity_State_PDU GenerateEntity()
	{
		// Generate a new value to use for our entity. Id, name, pos etc.
		KUINT16 randomValue = ++id;

		// First create the PDU we are going to send, for this example I will use a
		// Entity_State_PDU, When this PDU is sent most DIS applications should then show a new entity
		EntityIdentifier EntID( 1, 3001, randomValue );
		ForceID EntForceID( Friendly );
		EntityType EntType( 3, 1, 225, 3, 0, 1, 0 ); // A Civilian male
		Vector EntityLinearVelocity( 0, 0, 0 );

		// Location 
		KFLOAT64 GeoX = 3974445.65712107, GeoY = 220612.57183252, GeoZ = 4966838.38051275; // Cardiff 
		KFLOAT64 Heading = 0.0, Pitch = 0.0, Roll = 0.0;
		WorldCoordinates EntityLocation( GeoX, GeoY, GeoZ );

		// Appearance
		EntityAppearance EntEA; 
		DeadReckoningParameter DRP( Static, Vector( 0, 0, 0 ), Vector( 0, 0, 0 ) );
		KStringStream name;
		name << "Ent-" << randomValue;
		EntityMarking EntMarking( ASCII, name.str() );
		EntityCapabilities EntEC( false, false, false, false );

		// Create the PDU
		Entity_State_PDU Entity( EntID, EntForceID, EntType, EntType, EntityLinearVelocity, EntityLocation,
								 EulerAngles(), EntEA, DRP, EntMarking, EntEC );

		// Set the PDU Header values
		Entity.SetExerciseID( 1 );

		// Set the time stamp to automatically calculate each time encode is called.
		Entity.SetTimeStamp( TimeStamp( RelativeTime, 0, true ) );

		return Entity;
	}